

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 local_108 [8];
  string exception;
  string local_88;
  string local_68;
  string local_48;
  allocator<char> local_21;
  
  if (argc < 3) {
    printf("Launch parameters: ./substrings [input_file] [output_file]");
  }
  else {
    SuffixTree::GeneralizedSuffixTree::GeneralizedSuffixTree((GeneralizedSuffixTree *)local_108);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,argv[1],&local_21);
    SuffixTree::GeneralizedSuffixTree::BuildSuffixTreeFromFile
              ((GeneralizedSuffixTree *)local_108,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,argv[2],&local_21);
    SuffixTree::GeneralizedSuffixTree::DumpCommonStringsToFile
              ((GeneralizedSuffixTree *)local_108,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"gtree.dot","");
    SuffixTree::GeneralizedSuffixTree::DumpSuffixTreeToDotFile
              ((GeneralizedSuffixTree *)local_108,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    SuffixTree::GeneralizedSuffixTree::~GeneralizedSuffixTree((GeneralizedSuffixTree *)local_108);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 3)
	{
		printf ("Launch parameters: ./substrings [input_file] [output_file]");
		return 0;
	}
	try
    {
        SuffixTree::GeneralizedSuffixTree suffix_tree;
        suffix_tree.BuildSuffixTreeFromFile (argv[1]);
        suffix_tree.DumpCommonStringsToFile (argv[2]);
#ifndef NDEBUG
        suffix_tree.DumpSuffixTreeToDotFile ("gtree.dot");
#endif
    }
    catch (std::exception exception)
    {
        printf ("%s\n", exception.what());
        exit (EXIT_FAILURE);
    }
    catch (std::string exception)
    {
        printf ("%s\n", exception.c_str());
        exit (EXIT_FAILURE);
    }
    return 0;
}